

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O1

int gray_raster_render(QT_FT_Raster raster,QT_FT_Raster_Params *params)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  QT_FT_Bitmap *pQVar4;
  int *piVar5;
  PWorker worker;
  PCell_conflict *ppTVar6;
  QT_FT_Vector *pQVar7;
  char *pcVar8;
  int *piVar9;
  short sVar10;
  char cVar11;
  char cVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  QT_FT_Vector *pQVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int unaff_EBP;
  TCoord x;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  PCell_conflict pTVar27;
  long in_FS_OFFSET;
  undefined8 uVar28;
  undefined8 uVar29;
  TPos *pTStack_2e0;
  int iStack_2d8;
  int iStack_2d4;
  long lStack_2d0;
  long lStack_2c8;
  long lStack_2b8;
  long lStack_2b0;
  long lStack_38;
  
  if (((raster == (QT_FT_Raster)0x0) || (raster->buffer == (void *)0x0)) ||
     (raster->buffer_size == 0)) {
LAB_0039558d:
    iVar15 = -3;
  }
  else {
    pQVar4 = params->target;
    piVar5 = (int *)params->source;
    worker = raster->worker;
    worker->skip_spans = params->skip_spans;
    if (raster->buffer_allocated_size < 0x2000) {
      return -6;
    }
    if (piVar5 == (int *)0x0) {
      return -1;
    }
    if ((piVar5[1] == 0) || ((long)*piVar5 < 1)) {
      return 0;
    }
    if (*(long *)(piVar5 + 6) == 0) {
      return -1;
    }
    if (*(long *)(piVar5 + 2) == 0) {
      return -1;
    }
    if (piVar5[1] != *(int *)(*(long *)(piVar5 + 6) + -4 + (long)*piVar5 * 4) + 1) {
      return -1;
    }
    uVar3 = params->flags;
    if ((uVar3 & 2) == 0) {
      if (pQVar4 == (QT_FT_Bitmap *)0x0) goto LAB_0039558d;
      if (pQVar4->width == 0) {
        return 0;
      }
      if (pQVar4->rows == 0) {
        return 0;
      }
      if (pQVar4->buffer == (uchar *)0x0) {
        return -3;
      }
    }
    iVar15 = -2;
    if ((uVar3 & 1) != 0) {
      if ((uVar3 & 2) == 0) {
        (worker->clip_box).xMin = 0;
        (worker->clip_box).yMin = 0;
        uVar1 = pQVar4->rows;
        uVar2 = pQVar4->width;
        (worker->clip_box).xMax = uVar2;
        (worker->clip_box).yMax = uVar1;
      }
      else {
        if ((uVar3 & 4) == 0) {
          uVar28 = 0xff800000ff800000;
          uVar29 = 0x7fffff007fffff;
        }
        else {
          uVar28._0_4_ = (params->clip_box).xMin;
          uVar28._4_4_ = (params->clip_box).yMin;
          uVar29._0_4_ = (params->clip_box).xMax;
          uVar29._4_4_ = (params->clip_box).yMax;
        }
        (worker->clip_box).xMin = (int)uVar28;
        (worker->clip_box).yMin = (int)((ulong)uVar28 >> 0x20);
        (worker->clip_box).xMax = (int)uVar29;
        (worker->clip_box).yMax = (int)((ulong)uVar29 >> 0x20);
      }
      ppTVar6 = (PCell_conflict *)raster->buffer;
      lVar19 = raster->buffer_size;
      worker->buffer = ppTVar6;
      worker->buffer_size = lVar19;
      worker->ycells = ppTVar6;
      worker->area = 0;
      worker->cover = 0;
      worker->invalid = 1;
      worker->cells = (PCell_conflict)0x0;
      worker->max_cells = 0;
      worker->num_cells = 0;
      iVar15 = piVar5[1];
      pQVar7 = *(QT_FT_Vector **)(piVar5 + 2);
      pcVar8 = *(char **)(piVar5 + 4);
      piVar9 = *(int **)(piVar5 + 6);
      (worker->outline).n_contours = piVar5[0];
      (worker->outline).n_points = iVar15;
      (worker->outline).points = pQVar7;
      (worker->outline).tags = pcVar8;
      (worker->outline).contours = piVar9;
      iVar15 = piVar5[9];
      (worker->outline).flags = piVar5[8];
      *(int *)&(worker->outline).field_0x24 = iVar15;
      worker->num_cells = 0;
      worker->invalid = 1;
      worker->band_size = raster->band_size;
      if (pQVar4 != (QT_FT_Bitmap *)0x0) {
        (worker->target).palette = pQVar4->palette;
        iVar15 = pQVar4->rows;
        iVar20 = pQVar4->width;
        iVar16 = pQVar4->pitch;
        uVar14 = *(undefined4 *)&pQVar4->field_0xc;
        sVar10 = pQVar4->num_grays;
        cVar11 = pQVar4->pixel_mode;
        cVar12 = pQVar4->palette_mode;
        uVar13 = *(undefined4 *)&pQVar4->field_0x1c;
        (worker->target).buffer = pQVar4->buffer;
        (worker->target).num_grays = sVar10;
        (worker->target).pixel_mode = cVar11;
        (worker->target).palette_mode = cVar12;
        *(undefined4 *)&(worker->target).field_0x1c = uVar13;
        (worker->target).rows = iVar15;
        (worker->target).width = iVar20;
        (worker->target).pitch = iVar16;
        *(undefined4 *)&(worker->target).field_0xc = uVar14;
      }
      worker->render_span = gray_render_span;
      worker->render_span_data = worker;
      if ((params->flags & 2) != 0) {
        worker->render_span = params->gray_spans;
        worker->render_span_data = params->user;
        iVar15 = gray_convert_glyph(worker);
        return iVar15;
      }
      lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
      memset(&lStack_2b8,0xaa,0x280);
      worker->num_gray_spans = 0;
      iVar15 = (worker->outline).n_points;
      if ((long)iVar15 < 1) {
        worker->min_ey = 0;
        worker->max_ey = 0;
        worker->min_ex = 0;
        worker->max_ex = 0;
      }
      else {
        pQVar7 = (worker->outline).points;
        lVar19 = (long)pQVar7->x;
        worker->max_ex = lVar19;
        worker->min_ex = lVar19;
        lVar21 = (long)pQVar7->y;
        worker->max_ey = lVar21;
        worker->min_ey = lVar21;
        if (iVar15 != 1) {
          pQVar18 = pQVar7 + 1;
          lVar25 = lVar21;
          lVar23 = lVar19;
          do {
            lVar26 = (long)pQVar18->x;
            lVar24 = (long)pQVar18->y;
            if (lVar26 < lVar23) {
              worker->min_ex = lVar26;
              lVar23 = lVar26;
            }
            if (lVar19 < lVar26) {
              worker->max_ex = lVar26;
              lVar19 = lVar26;
            }
            if (lVar24 < lVar25) {
              worker->min_ey = lVar24;
              lVar25 = lVar24;
            }
            if (lVar21 < lVar24) {
              worker->max_ey = lVar24;
              lVar21 = lVar24;
            }
            pQVar18 = pQVar18 + 1;
          } while (pQVar18 < pQVar7 + iVar15);
        }
        worker->min_ex = worker->min_ex >> 6;
        worker->min_ey = worker->min_ey >> 6;
        worker->max_ex = worker->max_ex + 0x3f >> 6;
        worker->max_ey = worker->max_ey + 0x3f >> 6;
      }
      lVar19 = (long)(worker->clip_box).xMin;
      iVar15 = 0;
      if (lVar19 < worker->max_ex) {
        lVar21 = (long)(worker->clip_box).xMax;
        if (worker->min_ex < lVar21) {
          lVar25 = (long)(worker->clip_box).yMin;
          if (lVar25 < worker->max_ey) {
            lVar23 = (long)(worker->clip_box).yMax;
            if (worker->min_ey < lVar23) {
              if (worker->min_ex < lVar19) {
                worker->min_ex = lVar19;
              }
              if (worker->min_ey < lVar25) {
                worker->min_ey = lVar25;
              }
              if (lVar21 < worker->max_ex) {
                worker->max_ex = lVar21;
              }
              if (lVar23 < worker->max_ey) {
                worker->max_ey = lVar23;
              }
              lStack_2c8 = worker->min_ey;
              worker->count_ex = worker->max_ex - worker->min_ex;
              lVar19 = worker->max_ey;
              worker->count_ey = lVar19 - lStack_2c8;
              iStack_2d8 = (int)((lVar19 - lStack_2c8) / (long)worker->band_size);
              if (iStack_2d8 == 0) {
                iStack_2d8 = 1;
              }
              if (0x26 < iStack_2d8) {
                iStack_2d8 = 0x27;
              }
              worker->band_shoot = 0;
              iStack_2d4 = 0;
              if (0 < iStack_2d8) {
                do {
                  pTStack_2e0 = &lStack_2b8;
                  lStack_2d0 = worker->band_size + lStack_2c8;
                  if ((iStack_2d4 == iStack_2d8 + -1) || (lVar19 < lStack_2d0)) {
                    lStack_2d0 = lVar19;
                  }
                  lStack_2b8 = lStack_2c8;
                  lStack_2b0 = lStack_2d0;
                  iVar15 = unaff_EBP;
                  do {
                    worker->ycells = (PCell_conflict *)worker->buffer;
                    lVar25 = pTStack_2e0[1] - *pTStack_2e0;
                    worker->ycount = lVar25;
                    iVar16 = (int)lVar25 * 8;
                    lVar21 = (long)iVar16 + ((ulong)(long)iVar16 / 3 & 0xfffffffffffffff8) * -3;
                    iVar20 = (iVar16 - (int)lVar21) + 0x18;
                    if (lVar21 == 0) {
                      iVar20 = iVar16;
                    }
                    lVar21 = (long)((int)((ulong)(long)(int)worker->buffer_size / 0x18) * 0x18);
                    lVar24 = (long)iVar20;
                    worker->cells = (PCell_conflict)((long)worker->buffer + lVar24);
                    iVar20 = 7;
                    lVar23 = lVar21 - lVar24;
                    if (((lVar23 != 0 && lVar24 <= lVar21) &&
                        (worker->max_cells = (lVar23 >> 3) * -0x5555555555555555, 0x2f < lVar23)) &&
                       (iVar20 = 0, 0 < lVar25)) {
                      lVar21 = 0;
                      do {
                        worker->ycells[lVar21] = (PCell_conflict)0x0;
                        lVar21 = lVar21 + 1;
                      } while (lVar25 != lVar21);
                    }
                    iVar16 = iVar15;
                    if (iVar20 == 7) {
LAB_00395bcd:
                      lVar21 = *pTStack_2e0;
                      lVar25 = pTStack_2e0[1];
                      if ((ulong)(lVar25 - lVar21) < 2) {
                        iVar20 = 1;
                        iVar16 = -6;
                      }
                      else {
                        if ((long)worker->band_size <= lVar21 - lVar25) {
                          worker->band_shoot = worker->band_shoot + 1;
                        }
                        lVar23 = (lVar25 - lVar21 >> 1) + lVar21;
                        pTStack_2e0[2] = lVar21;
                        pTStack_2e0[3] = lVar23;
                        *pTStack_2e0 = lVar23;
                        pTStack_2e0[1] = lVar25;
                        pTStack_2e0 = pTStack_2e0 + 2;
                        iVar20 = 0;
                      }
                    }
                    else if (iVar20 == 0) {
                      worker->num_cells = 0;
                      worker->invalid = 1;
                      worker->min_ey = *pTStack_2e0;
                      worker->max_ey = pTStack_2e0[1];
                      worker->count_ey = pTStack_2e0[1] - *pTStack_2e0;
                      iVar17 = gray_convert_glyph_inner(worker);
                      if (iVar17 == -4) goto LAB_00395bcd;
                      iVar20 = 1;
                      iVar16 = 1;
                      if (iVar17 == 0) {
                        if ((worker->num_cells != 0) && (0 < worker->ycount)) {
                          lVar21 = 0;
                          do {
                            pTVar27 = worker->ycells[lVar21];
                            if (pTVar27 == (PCell_conflict)0x0) {
                              lVar25 = 0;
                              x = 0;
                            }
                            else {
                              x = 0;
                              lVar25 = 0;
                              do {
                                if ((lVar25 != 0) && (x < pTVar27->x)) {
                                  gray_hline(worker,x,lVar21,lVar25 << 9,pTVar27->x - (int)x);
                                }
                                lVar25 = lVar25 + pTVar27->cover;
                                lVar23 = lVar25 * 0x200 - pTVar27->area;
                                if ((lVar23 != 0) && (-1 < (long)pTVar27->x)) {
                                  gray_hline(worker,(long)pTVar27->x,lVar21,lVar23,1);
                                }
                                x = (long)pTVar27->x + 1;
                                pTVar27 = pTVar27->next;
                              } while (pTVar27 != (PCell)0x0);
                            }
                            if ((lVar25 != 0) && (x < worker->count_ex)) {
                              gray_hline(worker,x,lVar21,lVar25 << 9,(int)worker->count_ex - (int)x)
                              ;
                            }
                            lVar21 = lVar21 + 1;
                          } while (lVar21 < worker->ycount);
                        }
                        pTStack_2e0 = pTStack_2e0 + -2;
                        iVar20 = 5;
                        iVar16 = iVar15;
                      }
                    }
                    iVar15 = iVar16;
                    if ((iVar20 != 5) && (iVar20 != 0)) goto LAB_00395ce5;
                  } while (&lStack_2b8 <= pTStack_2e0);
                  iStack_2d4 = iStack_2d4 + 1;
                  lStack_2c8 = lStack_2d0;
                  unaff_EBP = iVar15;
                } while (iStack_2d4 < iStack_2d8);
              }
              if (worker->render_span != (QT_FT_SpanFunc)0x0) {
                uVar3 = worker->skip_spans;
                if ((int)uVar3 < worker->num_gray_spans) {
                  uVar22 = 0;
                  if (0 < (int)uVar3) {
                    uVar22 = (ulong)uVar3;
                  }
                  (*worker->render_span)
                            (worker->num_gray_spans - (int)uVar22,worker->gray_spans + uVar22,
                             worker->render_span_data);
                }
              }
              worker->skip_spans = worker->skip_spans - worker->num_gray_spans;
              iVar15 = 0;
              if ((8 < worker->band_shoot) && (0x10 < worker->band_size)) {
                worker->band_size = (uint)worker->band_size >> 1;
                iVar15 = 0;
              }
            }
          }
        }
      }
LAB_00395ce5:
      if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
        __stack_chk_fail();
      }
      return iVar15;
    }
  }
  return iVar15;
}

Assistant:

static int
  gray_raster_render( QT_FT_Raster                  raster,
                      const QT_FT_Raster_Params*  params )
  {
    const QT_FT_Outline*  outline    = (const QT_FT_Outline*)params->source;
    const QT_FT_Bitmap*   target_map = params->target;
    PWorker            worker;


    if ( !raster || !raster->buffer || !raster->buffer_size )
      return ErrRaster_Invalid_Argument;

    /* Should always be non-null, it is set by raster_reset() which is always */
    /* called with a non-null pool, and a pool_size >= MINIMUM_POOL_SIZE.     */
    assert(raster->worker);

    raster->worker->skip_spans = params->skip_spans;

    /* If raster object and raster buffer are allocated, but  */
    /* raster size isn't of the minimum size, indicate out of */
    /* memory.                                                */
    if (raster->buffer_allocated_size < MINIMUM_POOL_SIZE )
      return ErrRaster_OutOfMemory;

    if ( !outline )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    worker = raster->worker;

    /* if direct mode is not set, we must have a target bitmap */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      if ( !target_map )
        return ErrRaster_Invalid_Argument;

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return 0;

      if ( !target_map->buffer )
        return ErrRaster_Invalid_Argument;
    }

    /* this version does not support monochrome rendering */
    if ( !( params->flags & QT_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      /* compute clip box from target pixmap */
      ras.clip_box.xMin = 0;
      ras.clip_box.yMin = 0;
      ras.clip_box.xMax = target_map->width;
      ras.clip_box.yMax = target_map->rows;
    }
    else if ( params->flags & QT_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( worker, raster->buffer, raster->buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = raster->band_size;

    if ( target_map )
      ras.target = *target_map;

    ras.render_span      = (QT_FT_Raster_Span_Func)gray_render_span;
    ras.render_span_data = &ras;

    if ( params->flags & QT_FT_RASTER_FLAG_DIRECT )
    {
      ras.render_span      = (QT_FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;
    }

    return gray_convert_glyph( worker );
  }